

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpt.cpp
# Opt level: O0

unsigned_long pg::pm_val(int *pm,int k,int pl)

{
  int local_24;
  unsigned_long uStack_20;
  int i;
  unsigned_long res;
  int pl_local;
  int k_local;
  int *pm_local;
  
  uStack_20 = 0;
  for (local_24 = 0; local_24 < k; local_24 = local_24 + 1) {
    uStack_20 = uStack_20 * 2;
    if ((pm[local_24] != -1) && ((pm[local_24] & 1U) == pl)) {
      uStack_20 = uStack_20 + 1;
    }
  }
  return uStack_20;
}

Assistant:

static unsigned long
pm_val(int* pm, int k, int pl)
{
    unsigned long res=0;
    for (int i=0; i<k; i++) {
        res <<= 1;
        if (pm[i] != -1 and (pm[i]&1)==pl) res++;
    }
    return res;
}